

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer_factory.cc
# Opt level: O0

unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
draco::FileWriterFactory::OpenWriter(string *file_name)

{
  bool bVar1;
  reference pp_Var2;
  undefined8 in_RSI;
  vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *in_RDI;
  _func_unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *open_function;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *__range1;
  unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_> *writer;
  _Head_base<0UL,_draco::FileWriterInterface_*,_false> __lhs;
  int local_38;
  unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_> *this;
  __normal_iterator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(**)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  local_20;
  vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *local_18;
  undefined8 local_10;
  
  __lhs._M_head_impl = (FileWriterInterface *)in_RDI;
  local_10 = in_RSI;
  local_18 = (anonymous_namespace)::GetFileWriterOpenFunctions_abi_cxx11_();
  local_20._M_current =
       (_func_unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
        **)std::
           vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ::begin(in_RDI);
  std::
  vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(**)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                        *)__lhs._M_head_impl,
                       (__normal_iterator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(**)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                        *)in_RDI);
    if (!bVar1) {
      fprintf(_stderr,"%s:%d (%s): %s.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/io/file_writer_factory.cc"
              ,0x2a,"OpenWriter","No file writer able to open output");
      std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>::
      unique_ptr<std::default_delete<draco::FileWriterInterface>,void>
                ((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                  *)__lhs._M_head_impl,in_RDI);
      return (__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
              )(tuple<draco::FileWriterInterface_*,_std::default_delete<draco::FileWriterInterface>_>
                )__lhs._M_head_impl;
    }
    pp_Var2 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(**)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
              ::operator*(&local_20);
    this = (unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
            *)*pp_Var2;
    (*(code *)this)(in_RDI,local_10);
    bVar1 = std::operator==((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                             *)__lhs._M_head_impl,in_RDI);
    if (bVar1) {
      local_38 = 3;
      std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
      ::~unique_ptr(this);
    }
    else {
      local_38 = 1;
    }
    if (local_38 == 1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(**)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ::operator++(&local_20);
  }
  return (__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
            )__lhs._M_head_impl;
}

Assistant:

std::unique_ptr<FileWriterInterface> FileWriterFactory::OpenWriter(
    const std::string &file_name) {
  for (auto open_function : *GetFileWriterOpenFunctions()) {
    auto writer = open_function(file_name);
    if (writer == nullptr) {
      continue;
    }
    return writer;
  }
  FILEWRITER_LOG_ERROR("No file writer able to open output");
  return nullptr;
}